

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O0

UV_PREDICTION_MODE
read_intra_mode_uv(FRAME_CONTEXT *ec_ctx,aom_reader *r,CFL_ALLOWED_TYPE cfl_allowed,
                  PREDICTION_MODE y_mode)

{
  int iVar1;
  undefined1 in_CL;
  undefined1 in_DL;
  aom_reader *in_RSI;
  UV_PREDICTION_MODE uv_mode;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  
  iVar1 = aom_read_symbol_(in_RSI,(aom_cdf_prob *)
                                  CONCAT17(in_DL,CONCAT16(in_CL,CONCAT15(in_stack_ffffffffffffffed,
                                                                         in_stack_ffffffffffffffe8))
                                          ),0);
  return (UV_PREDICTION_MODE)iVar1;
}

Assistant:

static UV_PREDICTION_MODE read_intra_mode_uv(FRAME_CONTEXT *ec_ctx,
                                             aom_reader *r,
                                             CFL_ALLOWED_TYPE cfl_allowed,
                                             PREDICTION_MODE y_mode) {
  const UV_PREDICTION_MODE uv_mode =
      aom_read_symbol(r, ec_ctx->uv_mode_cdf[cfl_allowed][y_mode],
                      UV_INTRA_MODES - !cfl_allowed, ACCT_STR);
  return uv_mode;
}